

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O1

ogt_mesh *
ogt_mesh_from_paletted_voxels_simple
          (ogt_voxel_meshify_context *ctx,uint8_t *voxels,uint32_t size_x,uint32_t size_y,
          uint32_t size_z,ogt_mesh_rgba *palette)

{
  uint32_t uVar1;
  ogt_mesh *stream_func_data;
  uint uVar2;
  
  uVar1 = _count_voxel_sized_faces(voxels,size_x,size_y,size_z);
  uVar2 = uVar1 * 0x98 + 0x18;
  if (uVar2 == 0) {
    stream_func_data = (ogt_mesh *)0x0;
  }
  else if (ctx->alloc_func == (ogt_voxel_meshify_alloc_func)0x0) {
    stream_func_data = (ogt_mesh *)malloc((ulong)uVar2);
  }
  else {
    stream_func_data = (ogt_mesh *)(*ctx->alloc_func)((ulong)uVar2,ctx->alloc_free_user_data);
  }
  if (stream_func_data == (ogt_mesh *)0x0) {
    stream_func_data = (ogt_mesh *)0x0;
  }
  else {
    stream_func_data->vertices = (ogt_mesh_vertex *)(stream_func_data + 1);
    stream_func_data->indices =
         (uint32_t *)((long)stream_func_data + (ulong)(uVar1 * 4) * 0x20 + 0x18);
    stream_func_data->vertex_count = 0;
    stream_func_data->index_count = 0;
    ogt_stream_from_paletted_voxels_simple
              (voxels,size_x,size_y,size_z,palette,_streaming_add_to_mesh,stream_func_data);
    if (stream_func_data->vertex_count != uVar1 * 4) {
      __assert_fail("mesh->vertex_count == max_vertex_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                    ,0x241,
                    "ogt_mesh *ogt_mesh_from_paletted_voxels_simple(const ogt_voxel_meshify_context *, const uint8_t *, uint32_t, uint32_t, uint32_t, const ogt_mesh_rgba *)"
                   );
    }
    if (stream_func_data->index_count != uVar1 * 6) {
      __assert_fail("mesh->index_count == max_index_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                    ,0x242,
                    "ogt_mesh *ogt_mesh_from_paletted_voxels_simple(const ogt_voxel_meshify_context *, const uint8_t *, uint32_t, uint32_t, uint32_t, const ogt_mesh_rgba *)"
                   );
    }
  }
  return stream_func_data;
}

Assistant:

ogt_mesh* ogt_mesh_from_paletted_voxels_simple(
    const ogt_voxel_meshify_context* ctx,
    const uint8_t* voxels, uint32_t size_x, uint32_t size_y, uint32_t size_z, const ogt_mesh_rgba* palette) 
{
    uint32_t max_face_count   = _count_voxel_sized_faces( voxels, size_x, size_y, size_z );
    uint32_t max_vertex_count = max_face_count * 4;
    uint32_t max_index_count  = max_face_count * 6;
    
    uint32_t mesh_size = sizeof(ogt_mesh) + (max_vertex_count * sizeof(ogt_mesh_vertex)) + (max_index_count * sizeof(uint32_t));
    ogt_mesh* mesh = (ogt_mesh*)_voxel_meshify_malloc(ctx, mesh_size);
    if (!mesh)
        return NULL;
    
    mesh->vertices = (ogt_mesh_vertex*)&mesh[1];
    mesh->indices  = (uint32_t*)&mesh->vertices[max_vertex_count];
    mesh->vertex_count = 0;
    mesh->index_count  = 0;
    
    ogt_stream_from_paletted_voxels_simple(voxels, size_x, size_y, size_z, palette, _streaming_add_to_mesh, mesh);
    
    assert( mesh->vertex_count == max_vertex_count);
    assert( mesh->index_count == max_index_count);	
    return mesh;
}